

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfwht_gray.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
pow2Vector<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,size_t k)

{
  result_type rVar1;
  reference pvVar2;
  result_type_conflict1 rVar3;
  ulong local_1db0;
  size_t i;
  undefined1 local_1da0 [8];
  vector<double,_std::allocator<double>_> v;
  uniform_real_distribution<double> dis;
  undefined1 local_1d68 [8];
  mt19937_64 gen;
  random_device rd;
  size_t k_local;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_1d68,(ulong)rVar1);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,0.0,1.0);
  rd.field_0.field2[0x1380] = (undefined1)k;
  std::allocator<double>::allocator((allocator<double> *)((long)&i + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1da0,
             1L << (rd.field_0.field2[0x1380] & 0x3f),(allocator<double> *)((long)&i + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i + 7));
  for (local_1db0 = 0; local_1db0 < (ulong)(1L << (rd.field_0.field2[0x1380] & 0x3f));
      local_1db0 = local_1db0 + 1) {
    rVar3 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)
                       &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)local_1d68);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_1da0,local_1db0);
    *pvVar2 = rVar3;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_1da0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1da0);
  std::random_device::~random_device((random_device *)&gen._M_p);
  return __return_storage_ptr__;
}

Assistant:

auto pow2Vector( const size_t k ) {

  // random entries
  std::random_device                rd ;
  std::mt19937_64                   gen( rd() ) ;
  std::uniform_real_distribution<>  dis( 0.0, 1.0 ) ;

  // generate vector
  std::vector< T > v( size_t(1)<<k ) ;
  for ( size_t i = 0; i < (size_t(1)<<k); i++ ) {
    v[i] = dis(gen) ;
  }

  return v ;
}